

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ransac.hpp
# Opt level: O2

bool __thiscall
opengv::sac::Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
computeModel(Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem> *this,
            int debug_verbosity_level)

{
  int *piVar1;
  model_t *dst;
  int iVar2;
  element_type *peVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<int,_std::allocator<int>_> selection;
  model_t model_coefficients;
  double local_110;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> *local_d8;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_d0;
  Matrix<double,_3,_4,_0,_3,_4> local_c0;
  
  (this->super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
  iterations_ = 0;
  local_d8 = &(this->
              super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
              ).model_;
  piVar1 = &(this->
            super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
            ).iterations_;
  uVar9 = 0x80000001;
  uVar12 = 0;
  uVar13 = 0;
  local_f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dst = &(this->
         super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
         model_coefficients_;
  iVar2 = (this->
          super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>)
          .max_iterations_;
  local_110 = 1.0;
LAB_00283d7e:
  do {
    if ((local_110 <= (double)(int)uVar12) || ((uint)(iVar2 * 10) <= uVar13)) {
LAB_00283f70:
      if (0 < debug_verbosity_level) goto LAB_00283f77;
      goto LAB_00283fa5;
    }
    peVar3 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).sac_model_.
             super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      _vptr_SampleConsensusProblem[2])(peVar3,piVar1,&local_f0);
    if (local_f0._M_impl.super__Vector_impl_data._M_start ==
        local_f0._M_impl.super__Vector_impl_data._M_finish) {
      fwrite("[sm::RandomSampleConsensus::computeModel] No samples could be selected!\n",0x48,1,
             _stderr);
      goto LAB_00283f70;
    }
    peVar3 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).sac_model_.
             super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar10 = (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
               _vptr_SampleConsensusProblem[5])(peVar3,&local_f0,&local_c0);
    if ((char)iVar10 == '\0') {
      uVar12 = (ulong)(uint)*piVar1;
      uVar13 = uVar13 + 1;
      goto LAB_00283d7e;
    }
    peVar3 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).sac_model_.
             super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar11 = (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
               _vptr_SampleConsensusProblem[10])
                       ((this->
                        super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                        ).threshold_,peVar3,&local_c0);
    if ((int)uVar9 < (int)uVar11) {
      std::vector<int,_std::allocator<int>_>::operator=
                (local_d8,(vector<int,_std::allocator<int>_> *)&local_f0);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,3,4,0,3,4>>
                (dst,&local_c0);
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_d0,
                   &(((this->
                      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                      ).sac_model_.
                      super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                    indices_.
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      auVar7._8_8_ = in_XMM2_Qb;
      auVar7._0_8_ = in_XMM2_Qa;
      auVar7 = vcvtusi2sd_avx512f(auVar7,(long)((local_d0._M_ptr)->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)((local_d0._M_ptr)->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start >> 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      auVar8._8_8_ = in_XMM2_Qb;
      auVar8._0_8_ = in_XMM2_Qa;
      auVar8 = vcvtusi2sd_avx512f(auVar8,(long)local_f0._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_f0._M_impl.super__Vector_impl_data._M_start >>
                                         2);
      dVar14 = pow((double)(int)uVar11 / auVar7._0_8_,auVar8._0_8_);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = 1.0 - dVar14;
      auVar7 = vmaxsd_avx(auVar15,ZEXT816(0x3cb0000000000000));
      auVar7 = vminsd_avx(auVar7,ZEXT816(0x3feffffffffffffe));
      local_110 = log(1.0 - (this->
                            super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                            ).probability_);
      dVar14 = log(auVar7._0_8_);
      local_110 = local_110 / dVar14;
      uVar9 = uVar11;
    }
    uVar12 = (ulong)(*piVar1 + 1U);
    *piVar1 = *piVar1 + 1U;
    if (1 < debug_verbosity_level) {
      fprintf(_stdout,
              "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n"
              ,local_110,uVar12,(ulong)uVar11,(ulong)uVar9);
      uVar12 = (ulong)(uint)*piVar1;
    }
    if ((this->
        super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
        max_iterations_ < (int)uVar12) {
      if (0 < debug_verbosity_level) {
        fwrite("[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n"
               ,0x57,1,_stdout);
LAB_00283f77:
        fprintf(_stdout,"[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
                (long)(this->
                      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                      ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->
                      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                      ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2,(ulong)uVar9);
      }
LAB_00283fa5:
      piVar4 = (this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar4 == piVar5) {
        piVar6 = (this->
                 super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                 ).inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->
            super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
            ).inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != piVar6) {
          (this->
          super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>)
          .inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar6;
        }
      }
      else {
        peVar3 = (this->
                 super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                 ).sac_model_.
                 super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          _vptr_SampleConsensusProblem[9])
                  ((this->
                   super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                   ).threshold_,peVar3,dst,
                   &(this->
                    super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                    ).inliers_);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
      return piVar4 != piVar5;
    }
  } while( true );
}

Assistant:

bool
opengv::sac::Ransac<PROBLEM_T>::computeModel(
    int debug_verbosity_level)
{
  typedef PROBLEM_T problem_t;
  typedef typename problem_t::model_t model_t;

  iterations_ = 0;
  int n_best_inliers_count = -INT_MAX;
  double k = 1.0;

  std::vector<int> selection;
  model_t model_coefficients;

  int n_inliers_count = 0;
  unsigned skipped_count = 0;
  // supress infinite loops by just allowing 10 x maximum allowed iterations for
  // invalid model parameters!
  const unsigned max_skip = max_iterations_ * 10;

  // Iterate
  while( iterations_ < k && skipped_count < max_skip )
  {
    // Get X samples which satisfy the model criteria
    sac_model_->getSamples( iterations_, selection );

    if(selection.empty()) 
    {
      fprintf(stderr,
          "[sm::RandomSampleConsensus::computeModel] No samples could be selected!\n");
      break;
    }

    // Search for inliers in the point cloud for the current plane model M
    if(!sac_model_->computeModelCoefficients( selection, model_coefficients ))
    {
      //++iterations_;
      ++ skipped_count;
      continue;
    }

    // Select the inliers that are within threshold_ from the model
    //sac_model_->selectWithinDistance( model_coefficients, threshold_, inliers );
    //if(inliers.empty() && k > 1.0)
    //  continue;

    n_inliers_count = sac_model_->countWithinDistance(
        model_coefficients, threshold_ );

    // Better match ?
    if(n_inliers_count > n_best_inliers_count)
    {
      n_best_inliers_count = n_inliers_count;

      // Save the current model/inlier/coefficients selection as being the best so far
      model_              = selection;
      model_coefficients_ = model_coefficients;

      // Compute the k parameter (k=log(z)/log(1-w^n))
      double w = static_cast<double> (n_best_inliers_count) /
          static_cast<double> (sac_model_->getIndices()->size());
      double p_no_outliers = 1.0 - pow(w, static_cast<double> (selection.size()));
      p_no_outliers =
          (std::max) (std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by -Inf
      p_no_outliers =
          (std::min) (1.0 - std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by 0.
      k = log(1.0 - probability_) / log(p_no_outliers);
    }

    ++iterations_;
    if(debug_verbosity_level > 1)
      fprintf(stdout,
          "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n",
          iterations_, k, n_inliers_count, n_best_inliers_count );
    if(iterations_ > max_iterations_)
    {
      if(debug_verbosity_level > 0)
        fprintf(stdout,
            "[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n");
      break;
    }
  }

  if(debug_verbosity_level > 0)
    fprintf(stdout,
        "[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
        model_.size(), n_best_inliers_count );

  if(model_.empty())
  {
    inliers_.clear();
    return (false);
  }

  // Get the set of inliers that correspond to the best model found so far
  sac_model_->selectWithinDistance( model_coefficients_, threshold_, inliers_ );

  return (true);
}